

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::WrapKeySym(SoftHSM *this,CK_MECHANISM_PTR pMechanism,Token *token,OSObject *wrapKey,
                   ByteString *keydata,ByteString *wrapped)

{
  CK_MECHANISM_TYPE CVar1;
  char cVar2;
  int iVar3;
  CryptoFactory *pCVar4;
  undefined4 extraout_var;
  SoftHSM *this_00;
  CK_RV CVar6;
  undefined4 extraout_var_00;
  size_t sVar7;
  uchar *__dest;
  long lVar8;
  SoftHSM *pSVar9;
  undefined8 local_c0;
  size_t local_b8;
  ByteString iv;
  ByteString encryptedFinal;
  ByteString local_58;
  long *plVar5;
  
  pSVar9 = (SoftHSM *)keydata;
  ByteString::size(keydata);
  CVar1 = pMechanism->mechanism;
  if ((long)CVar1 < 0x1085) {
    if (CVar1 != 0x133) {
      if (CVar1 == 0x136) {
        local_b8 = 8;
        RFC5652Pad(pSVar9,keydata,8);
        goto LAB_001419e7;
      }
      if (CVar1 != 0x1082) {
        return 0x70;
      }
    }
    local_c0 = 0;
LAB_001419fc:
    local_b8 = 0;
  }
  else if (CVar1 == 0x1085) {
    local_b8 = 0x10;
    RFC5652Pad(pSVar9,keydata,0x10);
LAB_001419e7:
    local_c0 = 0;
  }
  else {
    if (CVar1 == 0x210a) {
      local_c0 = 2;
      goto LAB_001419fc;
    }
    if (CVar1 != 0x2109) {
      return 0x70;
    }
    sVar7 = RFC3394Pad(pSVar9,keydata);
    if (sVar7 < 0x10 || (sVar7 & 7) != 0) {
      return 0x62;
    }
    local_c0 = 1;
    local_b8 = 0;
  }
  pCVar4 = CryptoFactory::i();
  iVar3 = (**pCVar4->_vptr_CryptoFactory)(pCVar4);
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar5 == (long *)0x0) {
    return 0x70;
  }
  this_00 = (SoftHSM *)operator_new(0x38);
  pSVar9 = this_00;
  SymmetricKey::SymmetricKey((SymmetricKey *)this_00,0);
  CVar6 = getSymmetricKey(pSVar9,(SymmetricKey *)this_00,token,wrapKey);
  if (CVar6 != 0) {
    (**(code **)(*plVar5 + 0x50))(plVar5,this_00);
    pCVar4 = CryptoFactory::i();
    (*pCVar4->_vptr_CryptoFactory[1])(pCVar4,plVar5);
    return 5;
  }
  iVar3 = (*((Serialisable *)&this_00->_vptr_SoftHSM)->_vptr_Serialisable[4])(this_00);
  sVar7 = ByteString::size((ByteString *)CONCAT44(extraout_var_00,iVar3));
  (*((Serialisable *)&this_00->_vptr_SoftHSM)->_vptr_Serialisable[6])(this_00,sVar7 * 8);
  ByteString::ByteString(&iv);
  ByteString::ByteString(&encryptedFinal);
  CVar1 = pMechanism->mechanism;
  if ((long)CVar1 < 0x1082) {
    if ((CVar1 != 0x133) && (CVar1 != 0x136)) goto LAB_00141bc3;
LAB_00141aeb:
    ByteString::resize(&iv,local_b8);
    __dest = ByteString::operator[](&iv,0);
    memcpy(__dest,pMechanism->pParameter,local_b8);
    ByteString::ByteString(&local_58);
    cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5,this_00,1,&iv,0,0,&local_58,0);
    local_58._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_58.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
    if (cVar2 == '\0') {
      (**(code **)(*plVar5 + 0x50))(plVar5,this_00);
      pCVar4 = CryptoFactory::i();
      CVar6 = 0x70;
      (*pCVar4->_vptr_CryptoFactory[1])(pCVar4,plVar5);
      goto LAB_00141c25;
    }
    cVar2 = (**(code **)(*plVar5 + 0x18))(plVar5,keydata,wrapped);
    lVar8 = *plVar5;
    if (cVar2 == '\0') goto LAB_00141c05;
    cVar2 = (**(code **)(lVar8 + 0x20))(plVar5,&encryptedFinal);
    if (cVar2 == '\0') goto LAB_00141c02;
    ByteString::operator+=(wrapped,&encryptedFinal);
  }
  else {
    if ((CVar1 == 0x1082) || (CVar1 == 0x1085)) goto LAB_00141aeb;
LAB_00141bc3:
    cVar2 = (**(code **)(*plVar5 + 0x40))(plVar5,this_00,local_c0,keydata,wrapped);
    if (cVar2 == '\0') {
LAB_00141c02:
      lVar8 = *plVar5;
LAB_00141c05:
      (**(code **)(lVar8 + 0x50))(plVar5,this_00);
      pCVar4 = CryptoFactory::i();
      CVar6 = 5;
      (*pCVar4->_vptr_CryptoFactory[1])(pCVar4,plVar5);
      goto LAB_00141c25;
    }
  }
  (**(code **)(*plVar5 + 0x50))(plVar5,this_00);
  pCVar4 = CryptoFactory::i();
  (*pCVar4->_vptr_CryptoFactory[1])(pCVar4,plVar5);
  CVar6 = 0;
LAB_00141c25:
  encryptedFinal._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&encryptedFinal.byteString.
              super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  iv._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
  std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
            (&iv.byteString.super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  return CVar6;
}

Assistant:

CK_RV SoftHSM::WrapKeySym
(
	CK_MECHANISM_PTR pMechanism,
	Token* token,
	OSObject* wrapKey,
	ByteString& keydata,
	ByteString& wrapped
)
{
	// Get the symmetric algorithm matching the mechanism
	SymAlgo::Type algo = SymAlgo::Unknown;
	SymWrap::Type mode = SymWrap::Unknown;
	size_t bb = 8;
	size_t blocksize = 0;
	auto wrappedlen = keydata.size();

	switch(pMechanism->mechanism) {
#ifdef HAVE_AES_KEY_WRAP
		case CKM_AES_KEY_WRAP:
			wrappedlen = RFC3394Pad(keydata);
			if ((wrappedlen < 16) || ((wrappedlen % 8) != 0))
				return CKR_KEY_SIZE_RANGE;
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP;
			break;
#endif
#ifdef HAVE_AES_KEY_WRAP_PAD
		case CKM_AES_KEY_WRAP_PAD:
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP_PAD;
			break;
#endif
		case CKM_AES_CBC:
			algo = SymAlgo::AES;
			break;
			
		case CKM_AES_CBC_PAD:
			blocksize = 16;
			wrappedlen = RFC5652Pad(keydata, blocksize);
			algo = SymAlgo::AES;
			break;
			
		case CKM_DES3_CBC:
			algo = SymAlgo::DES3;
			break;
			
		case CKM_DES3_CBC_PAD:
			blocksize = 8;
			wrappedlen = RFC5652Pad(keydata, blocksize);
			algo = SymAlgo::DES3;
			break;
			
		default:
			return CKR_MECHANISM_INVALID;
	}
	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(algo);
	if (cipher == NULL) return CKR_MECHANISM_INVALID;

	SymmetricKey* wrappingkey = new SymmetricKey();

	if (getSymmetricKey(wrappingkey, token, wrapKey) != CKR_OK)
	{
		cipher->recycleKey(wrappingkey);
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return CKR_GENERAL_ERROR;
	}

	// adjust key bit length
	wrappingkey->setBitLen(wrappingkey->getKeyBits().size() * bb);

	ByteString iv;
	ByteString encryptedFinal;

	switch(pMechanism->mechanism) {

		case CKM_AES_CBC:
	        case CKM_AES_CBC_PAD:
		case CKM_DES3_CBC:
	        case CKM_DES3_CBC_PAD:
			iv.resize(blocksize);
			memcpy(&iv[0], pMechanism->pParameter, blocksize);
			
			if (!cipher->encryptInit(wrappingkey, SymMode::CBC, iv, false))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_MECHANISM_INVALID;
			}
			if (!cipher->encryptUpdate(keydata, wrapped))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_GENERAL_ERROR;
			}
			// Finalize encryption
			if (!cipher->encryptFinal(encryptedFinal))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_GENERAL_ERROR;
			}
			wrapped += encryptedFinal;
			break;
		default:
			// Wrap the key
			if (!cipher->wrapKey(wrappingkey, mode, keydata, wrapped))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_GENERAL_ERROR;
			}
	}

	cipher->recycleKey(wrappingkey);
	CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
	return CKR_OK;
}